

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O3

void CreateBackwardReferencesNH42
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals,BackwardReferenceFromDecoder *backward_references,
               size_t *back_refs_position,size_t back_refs_size)

{
  ulong uVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  size_t sVar9;
  int iVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  size_t *psVar15;
  ulong uVar16;
  ulong uVar17;
  undefined8 uVar18;
  void *pvVar19;
  byte bVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  char *pcVar25;
  short sVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  int iVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  size_t sVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  uint uVar40;
  size_t *psVar41;
  ulong uVar42;
  uint uVar43;
  uint32_t *addr_4;
  long lVar44;
  ulong uVar45;
  long lVar46;
  size_t key_1;
  ushort uVar47;
  uint uVar48;
  int *piVar49;
  long lVar50;
  bool bVar51;
  undefined1 auVar52 [16];
  int *local_180;
  int *local_168;
  ulong local_158;
  ulong local_150;
  ulong local_140;
  ulong local_138;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_f0;
  ulong local_e8;
  ulong local_d8;
  size_t *local_d0;
  ulong local_c0;
  ulong local_b0;
  
  bVar20 = literal_context_lut[8];
  lVar8 = *(long *)(literal_context_lut + 0x10);
  uVar4 = (position - 3) + num_bytes;
  sVar35 = position;
  if (3 < num_bytes) {
    sVar35 = uVar4;
  }
  lVar44 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    lVar44 = 0x40;
  }
  local_138 = *(ulong *)dist_cache;
  pvVar19 = (hasher->common).extra;
  iVar14 = (int)pvVar19;
  iVar31 = (int)((ulong)pvVar19 >> 0x20);
  *(int *)&(hasher->common).dict_num_matches = iVar14 + -1;
  *(int *)((long)&(hasher->common).dict_num_matches + 4) = iVar14 + 1;
  (hasher->common).params.type = iVar14 + -2;
  (hasher->common).params.bucket_bits = iVar14 + 2;
  (hasher->common).params.block_bits = iVar14 + -3;
  (hasher->common).params.hash_len = iVar14 + 3;
  (hasher->common).params.num_last_distances_to_check = iVar31 + -1;
  (hasher->common).is_prepared_ = iVar31 + 1;
  *(int *)&hasher->privat = iVar31 + -2;
  *(int *)((long)&hasher->privat + 4) = iVar31 + 2;
  *(int *)((long)&hasher->privat + 8) = iVar31 + -3;
  *(int *)((long)&hasher->privat + 0xc) = iVar31 + 3;
  uVar1 = position + num_bytes;
  if (uVar1 <= position + 4) {
    local_d0 = last_insert_len;
LAB_0010d3f7:
    *(ulong *)dist_cache = (local_138 + uVar1) - position;
    *(long *)commands = *(long *)commands + ((long)local_d0 - (long)last_insert_len >> 4);
    return;
  }
  uVar42 = (1L << (bVar20 & 0x3f)) - 0x10;
  local_b0 = lVar44 + position;
  lVar3 = position - 1;
  local_d0 = last_insert_len;
  uVar33 = position;
  auVar52 = _DAT_0013b100;
LAB_0010b71d:
  local_150 = uVar1 - uVar33;
  uVar22 = uVar42;
  if (uVar33 < uVar42) {
    uVar22 = uVar33;
  }
  local_c0 = lVar8 + uVar33;
  if (uVar42 <= lVar8 + uVar33) {
    local_c0 = uVar42;
  }
  uVar16 = *(ulong *)(literal_context_lut + 0x50);
  lVar28 = *(long *)&params[7].dist.alphabet_size_max;
  uVar27 = uVar33 & ringbuffer_mask;
  piVar2 = (int *)(ringbuffer + uVar27);
  iVar14 = *(int *)(ringbuffer + uVar27);
  psVar41 = *(size_t **)backward_references;
  if (back_refs_position <= psVar41) {
    bVar51 = false;
    bVar11 = back_refs_position == (size_t *)0x0;
LAB_0010b8cf:
    uVar40 = (uint)(iVar14 * 0x1e35a7bd) >> 0x11;
    uVar34 = (ulong)uVar40;
    uVar36 = (ulong)((uint)local_150 & 7);
    uVar39 = local_150 & 0xfffffffffffffff8;
    local_110 = 0x7e4;
    uVar21 = 0;
    lVar46 = 0;
    local_f0 = 0;
    local_e8 = 0;
    do {
      uVar23 = (ulong)*(int *)((long)&(hasher->common).extra + lVar46 * 4);
      uVar17 = uVar33 - uVar23;
      if ((((lVar46 == 0) || (*(char *)(lVar28 + 0x30000 + (uVar17 & 0xffff)) == (char)uVar40)) &&
          (uVar23 <= uVar22)) && (uVar17 < uVar33)) {
        if (7 < local_150) {
          lVar50 = 0;
          uVar45 = 0;
LAB_0010b9ac:
          if (*(ulong *)(piVar2 + uVar45 * 2) ==
              *(ulong *)(ringbuffer + uVar45 * 8 + (uVar17 & ringbuffer_mask)))
          goto code_r0x0010b9be;
          uVar45 = *(ulong *)(ringbuffer + uVar45 * 8 + (uVar17 & ringbuffer_mask)) ^
                   *(ulong *)(piVar2 + uVar45 * 2);
          uVar17 = 0;
          if (uVar45 != 0) {
            for (; (uVar45 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
            }
          }
          uVar45 = (uVar17 >> 3 & 0x1fffffff) - lVar50;
          goto LAB_0010b9fb;
        }
        uVar24 = 0;
        piVar49 = piVar2;
LAB_0010ba87:
        uVar45 = uVar24;
        if (uVar36 != 0) {
          uVar30 = uVar36 | uVar24;
          uVar29 = uVar36;
          do {
            uVar45 = uVar24;
            if (ringbuffer[uVar24 + (uVar17 & ringbuffer_mask)] != (uint8_t)*piVar49) break;
            piVar49 = (int *)((long)piVar49 + 1);
            uVar24 = uVar24 + 1;
            uVar29 = uVar29 - 1;
            uVar45 = uVar30;
          } while (uVar29 != 0);
        }
LAB_0010b9fb:
        if ((bVar51) &&
           (uVar17 = (ulong)(int)num_literals[(long)psVar41 * 2], uVar17 < uVar45 + uVar33)) {
          uVar45 = uVar17 - uVar33;
        }
        if ((1 < uVar45) && (uVar17 = uVar45 * 0x87 + 0x78f, local_110 < uVar17)) {
          if (lVar46 != 0) {
            uVar17 = uVar17 - ((0x1ca10U >> ((byte)lVar46 & 0xe) & 0xe) + 0x27);
          }
          if (local_110 < uVar17) {
            uVar21 = uVar45;
            local_110 = uVar17;
            local_f0 = uVar45;
            local_e8 = uVar23;
          }
        }
      }
      lVar46 = lVar46 + 1;
    } while (lVar46 != 0x10);
    uVar43 = uVar40 & 0x1ff;
    lVar46._0_4_ = params[7].dist.distance_postfix_bits;
    lVar46._4_4_ = params[7].dist.num_direct_distance_codes;
    uVar23 = uVar33 - *(uint *)(lVar28 + uVar34 * 4);
    uVar5 = *(ushort *)(lVar28 + 0x20000 + uVar34 * 2);
    if (lVar46 != 0) {
      lVar50 = (ulong)(uVar43 << 0xb) + lVar28 + 0x40000;
      uVar45 = 0;
      uVar17 = uVar23;
      uVar47 = uVar5;
      do {
        uVar45 = uVar17 + uVar45;
        if (uVar22 < uVar45) break;
        if (uVar27 + uVar21 <= ringbuffer_mask) {
          uVar17 = uVar33 - uVar45 & ringbuffer_mask;
          if ((uVar21 + uVar17 <= ringbuffer_mask) &&
             (ringbuffer[uVar27 + uVar21] == ringbuffer[uVar21 + uVar17])) {
            if (7 < local_150) {
              lVar32 = 0;
              uVar24 = 0;
LAB_0010bb6c:
              if (*(ulong *)(piVar2 + uVar24 * 2) == *(ulong *)(ringbuffer + uVar24 * 8 + uVar17))
              goto code_r0x0010bb7f;
              uVar24 = *(ulong *)(ringbuffer + uVar24 * 8 + uVar17) ^
                       *(ulong *)(piVar2 + uVar24 * 2);
              uVar17 = 0;
              if (uVar24 != 0) {
                for (; (uVar24 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                }
              }
              uVar24 = (uVar17 >> 3 & 0x1fffffff) - lVar32;
              goto LAB_0010bbda;
            }
            piVar49 = piVar2;
            uVar29 = 0;
LAB_0010bc56:
            uVar24 = uVar29;
            if (uVar36 != 0) {
              uVar37 = uVar36 | uVar29;
              uVar30 = uVar36;
              do {
                uVar24 = uVar29;
                if (ringbuffer[uVar29 + uVar17] != (uint8_t)*piVar49) break;
                piVar49 = (int *)((long)piVar49 + 1);
                uVar29 = uVar29 + 1;
                uVar30 = uVar30 - 1;
                uVar24 = uVar37;
              } while (uVar30 != 0);
            }
LAB_0010bbda:
            if ((bVar51) &&
               (uVar17 = (ulong)(int)num_literals[(long)psVar41 * 2], uVar17 < uVar24 + uVar33)) {
              uVar24 = uVar17 - uVar33;
            }
            if (3 < uVar24) {
              iVar14 = 0x1f;
              if ((uint)uVar45 != 0) {
                for (; (uint)uVar45 >> iVar14 == 0; iVar14 = iVar14 + -1) {
                }
              }
              uVar17 = (ulong)(iVar14 * -0x1e + 0x780) + uVar24 * 0x87;
              if (local_110 < uVar17) {
                uVar21 = uVar24;
                local_110 = uVar17;
                local_f0 = uVar24;
                local_e8 = uVar45;
              }
            }
          }
        }
        uVar17 = (ulong)uVar47;
        uVar47 = *(ushort *)(lVar50 + 2 + uVar17 * 4);
        uVar17 = (ulong)*(ushort *)(lVar50 + uVar17 * 4);
        lVar46 = lVar46 + -1;
      } while (lVar46 != 0);
    }
    uVar47 = *(ushort *)((long)&(params->hasher).block_bits + (ulong)uVar43 * 2);
    *(ushort *)((long)&(params->hasher).block_bits + (ulong)uVar43 * 2) = uVar47 + 1;
    uVar48 = uVar47 & 0x1ff;
    *(char *)(lVar28 + 0x30000 + (uVar33 & 0xffff)) = (char)uVar40;
    if (0xfffe < uVar23) {
      uVar23 = 0xffff;
    }
    lVar46 = lVar28 + 0x40000 + (ulong)(uVar43 << 0xb);
    *(short *)(lVar46 + (ulong)uVar48 * 4) = (short)uVar23;
    *(ushort *)(lVar46 + 2 + (ulong)uVar48 * 4) = uVar5;
    *(int *)(lVar28 + uVar34 * 4) = (int)uVar33;
    *(short *)(lVar28 + 0x20000 + uVar34 * 2) = (short)uVar48;
    if (local_110 != 0x7e4) {
      iVar14 = 0;
      bVar51 = true;
      goto LAB_0010bf89;
    }
    if (!bVar11) {
      psVar41 = *(size_t **)backward_references;
      goto LAB_0010cb73;
    }
    sVar9 = params[7].dist.max_distance;
    uVar22 = *(ulong *)(sVar9 + 8);
    local_158 = *(ulong *)(sVar9 + 0x10);
    bVar11 = true;
    if (uVar22 >> 7 <= local_158) {
      uVar27 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
      lVar28 = *(long *)(literal_context_lut + 0x78);
      iVar14 = 0;
      local_110 = 0x7e4;
      bVar51 = true;
LAB_0010bda3:
      uVar22 = uVar22 + 1;
      *(ulong *)(sVar9 + 8) = uVar22;
      bVar20 = *(byte *)(lVar28 + uVar27);
      uVar21 = (ulong)bVar20;
      if ((uVar21 != 0) && (uVar21 <= local_150)) {
        uVar36 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar27 * 2);
        lVar46 = *(long *)(literal_context_lut + 0x58);
        pcVar25 = (char *)(uVar36 * uVar21 + *(long *)(lVar46 + 0xa8) +
                          (ulong)*(uint *)(lVar46 + 0x20 + uVar21 * 4));
        if (7 < bVar20) {
          uVar39 = (ulong)(bVar20 & 0xfffffff8);
          lVar50 = 0;
          uVar34 = 0;
LAB_0010be06:
          if (*(ulong *)(pcVar25 + uVar34 * 8) == *(ulong *)(piVar2 + uVar34 * 2))
          goto code_r0x0010be18;
          uVar34 = *(ulong *)(piVar2 + uVar34 * 2) ^ *(ulong *)(pcVar25 + uVar34 * 8);
          uVar39 = 0;
          if (uVar34 != 0) {
            for (; (uVar34 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
            }
          }
          uVar34 = (uVar39 >> 3 & 0x1fffffff) - lVar50;
          goto LAB_0010be53;
        }
        uVar39 = 0;
        goto LAB_0010bf2a;
      }
      goto LAB_0010beaf;
    }
    goto LAB_0010c91e;
  }
  uVar21 = (ulong)(int)num_literals[(long)psVar41 * 2];
  if (uVar21 < uVar33) {
    psVar15 = num_literals + (long)psVar41 * 2;
    do {
      psVar41 = (size_t *)((long)psVar41 + 1);
      if (back_refs_position == psVar41) {
        *(size_t **)backward_references = psVar41;
        bVar51 = false;
        psVar41 = back_refs_position;
        goto LAB_0010b8c7;
      }
      uVar21 = (ulong)(int)psVar15[2];
      psVar15 = psVar15 + 2;
    } while (uVar21 < uVar33);
    *(size_t **)backward_references = psVar41;
    bVar51 = psVar41 < back_refs_position;
  }
  else {
    psVar15 = num_literals + (long)psVar41 * 2;
    bVar51 = true;
  }
  if (uVar33 != uVar21) {
LAB_0010b8c7:
    bVar11 = false;
    goto LAB_0010b8cf;
  }
  uVar40 = (uint)psVar15[1];
  local_e8 = (ulong)(int)uVar40;
  if ((uVar33 - local_e8 < uVar33) && (uVar40 <= *(uint *)((long)psVar15 + 0xc))) {
    uVar22 = uVar33 - local_e8 & ringbuffer_mask;
    if (7 < local_150) {
      uVar16 = local_150 & 0xfffffffffffffff8;
      local_168 = (int *)(ringbuffer + uVar16 + uVar27);
      lVar28 = 0;
      uVar27 = 0;
LAB_0010b878:
      if (*(ulong *)(piVar2 + uVar27 * 2) == *(ulong *)(ringbuffer + uVar27 * 8 + uVar22))
      goto code_r0x0010b88e;
      uVar16 = *(ulong *)(ringbuffer + uVar27 * 8 + uVar22) ^ *(ulong *)(piVar2 + uVar27 * 2);
      uVar22 = 0;
      if (uVar16 != 0) {
        for (; (uVar16 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
        }
      }
      uVar27 = (uVar22 >> 3 & 0x1fffffff) - lVar28;
      goto LAB_0010ccb5;
    }
    uVar16 = 0;
    local_168 = piVar2;
LAB_0010d379:
    uVar21 = local_150 & 7;
    uVar27 = uVar16;
    if (uVar21 != 0) {
      uVar36 = uVar16 | uVar21;
      do {
        uVar27 = uVar16;
        if (ringbuffer[uVar16 + uVar22] != (uint8_t)*local_168) break;
        local_168 = (int *)((long)local_168 + 1);
        uVar16 = uVar16 + 1;
        uVar21 = uVar21 - 1;
        uVar27 = uVar36;
      } while (uVar21 != 0);
    }
LAB_0010ccb5:
    local_f0 = (ulong)*(int *)((long)num_literals + (long)psVar41 * 0x10 + 4);
    if (uVar27 < local_f0) {
      local_f0 = uVar27;
    }
    iVar14 = 0x1f;
    if (uVar40 != 0) {
      for (; uVar40 >> iVar14 == 0; iVar14 = iVar14 + -1) {
      }
    }
    local_110 = (ulong)(iVar14 * -0x1e + 0x780) + local_f0 * 0x87;
    iVar14 = 0;
LAB_0010ccfd:
    bVar11 = false;
    bVar51 = false;
    goto LAB_0010bf89;
  }
LAB_0010cb73:
  if ((psVar41 < back_refs_position) && (uVar33 == (long)(int)num_literals[(long)psVar41 * 2])) {
    uVar40 = (uint)num_literals[(long)psVar41 * 2 + 1];
    local_e8 = (ulong)(int)uVar40;
    if (*(int *)((long)num_literals + (long)psVar41 * 0x10 + 0xc) < (int)uVar40) {
      uVar43 = *(uint *)((long)num_literals + (long)psVar41 * 0x10 + 4);
      uVar16 = (ulong)uVar43;
      if (uVar43 - 4 < 0x15 && (int)uVar40 < 0x7ffffffd) {
        uVar48 = ~(uint)uVar22 + uVar40;
        lVar28 = *(long *)(literal_context_lut + 0x58);
        iVar14 = (int)uVar48 >> (*(byte *)(lVar28 + uVar16) & 0x1f);
        if (iVar14 < *(int *)(literal_context_lut + 0x60)) {
          uVar7 = *(uint *)(lVar28 + 0x20 + uVar16 * 4);
          uVar6 = kBitMask[*(byte *)(lVar28 + uVar16)];
          lVar28 = *(long *)(lVar28 + 0xa8);
          uVar18 = BrotliGetTransforms();
          pvVar19 = malloc(uVar16 * 10);
          iVar14 = BrotliTransformDictionaryWord
                             (pvVar19,(ulong)uVar7 + lVar28 + (long)(int)((uVar48 & uVar6) * uVar43)
                              ,uVar43,uVar18,iVar14);
          local_f0 = (ulong)iVar14;
          iVar31 = bcmp(piVar2,pvVar19,local_f0);
          auVar52 = _DAT_0013b100;
          if (iVar31 == 0) {
            iVar31 = 0x1f;
            if (uVar40 != 0) {
              for (; uVar40 >> iVar31 == 0; iVar31 = iVar31 + -1) {
              }
            }
            local_110 = (ulong)(iVar31 * -0x1e + 0x780) + local_f0 * 0x87;
            iVar14 = uVar43 - iVar14;
            goto LAB_0010ccfd;
          }
        }
      }
    }
  }
  local_138 = local_138 + 1;
  position = uVar33 + 1;
  goto LAB_0010d14a;
code_r0x0010b9be:
  uVar45 = uVar45 + 1;
  lVar50 = lVar50 + -8;
  uVar24 = uVar39;
  piVar49 = (int *)(ringbuffer + uVar39 + uVar27);
  if (local_150 >> 3 == uVar45) goto LAB_0010ba87;
  goto LAB_0010b9ac;
code_r0x0010bb7f:
  uVar24 = uVar24 + 1;
  lVar32 = lVar32 + -8;
  piVar49 = (int *)(ringbuffer + uVar39 + uVar27);
  uVar29 = uVar39;
  if (local_150 >> 3 == uVar24) goto LAB_0010bc56;
  goto LAB_0010bb6c;
code_r0x0010be18:
  uVar34 = uVar34 + 1;
  lVar50 = lVar50 + -8;
  if (bVar20 >> 3 == uVar34) goto code_r0x0010be24;
  goto LAB_0010be06;
code_r0x0010be24:
  pcVar25 = pcVar25 + -lVar50;
LAB_0010bf2a:
  uVar23 = uVar21 & 7;
  uVar34 = uVar39;
  if ((bVar20 & 7) != 0) {
    uVar17 = uVar39 | uVar23;
    do {
      uVar34 = uVar39;
      if (*(char *)((long)piVar2 + uVar39) != *pcVar25) break;
      pcVar25 = pcVar25 + 1;
      uVar39 = uVar39 + 1;
      uVar23 = uVar23 - 1;
      uVar34 = uVar17;
    } while (uVar23 != 0);
  }
LAB_0010be53:
  if (((uVar34 != 0) && (uVar21 < *(uint *)(literal_context_lut + 100) + uVar34)) &&
     (uVar21 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                              ((char)(uVar21 - uVar34) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar21 - uVar34) * 4 << (*(byte *)(lVar46 + uVar21) & 0x3f)) +
               uVar36 + local_c0 + 1, uVar21 <= uVar16)) {
    iVar31 = 0x1f;
    if ((uint)uVar21 != 0) {
      for (; (uint)uVar21 >> iVar31 == 0; iVar31 = iVar31 + -1) {
      }
    }
    uVar36 = (uVar34 * 0x87 - (ulong)(uint)(iVar31 * 0x1e)) + 0x780;
    if (local_110 <= uVar36) {
      iVar14 = (uint)bVar20 - (int)uVar34;
      local_158 = local_158 + 1;
      *(ulong *)(sVar9 + 0x10) = local_158;
      local_f0 = uVar34;
      local_110 = uVar36;
      local_e8 = uVar21;
    }
  }
LAB_0010beaf:
  uVar27 = uVar27 + 1;
  bVar11 = !bVar51;
  bVar51 = false;
  if (bVar11) goto LAB_0010ca66;
  goto LAB_0010bda3;
LAB_0010ca66:
  bVar11 = true;
  bVar51 = true;
LAB_0010bf89:
  if (local_110 < 0x7e5) {
LAB_0010c91e:
    local_138 = local_138 + 1;
    position = uVar33 + 1;
    if (bVar11 && local_b0 < position) {
      if ((uint)((int)lVar44 * 4) + local_b0 < position) {
        uVar22 = uVar33 + 0x11;
        if (uVar1 - 4 <= uVar33 + 0x11) {
          uVar22 = uVar1 - 4;
        }
        if (position < uVar22) {
          lVar28 = *(long *)&params[7].dist.alphabet_size_max;
          do {
            uVar40 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                     0x11;
            uVar33 = (ulong)uVar40;
            uVar48 = uVar40 & 0x1ff;
            uVar5 = *(ushort *)((long)&(params->hasher).block_bits + (ulong)uVar48 * 2);
            *(ushort *)((long)&(params->hasher).block_bits + (ulong)uVar48 * 2) = uVar5 + 1;
            uVar43 = uVar5 & 0x1ff;
            uVar16 = position - *(uint *)(lVar28 + uVar33 * 4);
            if (0xfffe < uVar16) {
              uVar16 = 0xffff;
            }
            *(char *)(lVar28 + 0x30000 + (position & 0xffff)) = (char)uVar40;
            lVar46 = (ulong)(uVar48 << 0xb) + lVar28 + 0x40000;
            *(short *)(lVar46 + (ulong)uVar43 * 4) = (short)uVar16;
            *(undefined2 *)(lVar46 + 2 + (ulong)uVar43 * 4) =
                 *(undefined2 *)(lVar28 + 0x20000 + uVar33 * 2);
            *(int *)(lVar28 + uVar33 * 4) = (int)position;
            *(short *)(lVar28 + 0x20000 + uVar33 * 2) = (short)uVar43;
            local_138 = local_138 + 4;
            position = position + 4;
          } while (position < uVar22);
        }
      }
      else {
        uVar22 = uVar33 + 9;
        if (uVar4 <= uVar33 + 9) {
          uVar22 = uVar4;
        }
        if (position < uVar22) {
          lVar28 = *(long *)&params[7].dist.alphabet_size_max;
          do {
            uVar40 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                     0x11;
            uVar33 = (ulong)uVar40;
            uVar48 = uVar40 & 0x1ff;
            uVar5 = *(ushort *)((long)&(params->hasher).block_bits + (ulong)uVar48 * 2);
            *(ushort *)((long)&(params->hasher).block_bits + (ulong)uVar48 * 2) = uVar5 + 1;
            uVar43 = uVar5 & 0x1ff;
            uVar16 = position - *(uint *)(lVar28 + uVar33 * 4);
            if (0xfffe < uVar16) {
              uVar16 = 0xffff;
            }
            *(char *)(lVar28 + 0x30000 + (position & 0xffff)) = (char)uVar40;
            lVar46 = (ulong)(uVar48 << 0xb) + lVar28 + 0x40000;
            *(short *)(lVar46 + (ulong)uVar43 * 4) = (short)uVar16;
            *(undefined2 *)(lVar46 + 2 + (ulong)uVar43 * 4) =
                 *(undefined2 *)(lVar28 + 0x20000 + uVar33 * 2);
            *(int *)(lVar28 + uVar33 * 4) = (int)position;
            *(short *)(lVar28 + 0x20000 + uVar33 * 2) = (short)uVar43;
            local_138 = local_138 + 2;
            position = position + 2;
          } while (position < uVar22);
        }
      }
    }
    goto LAB_0010d14a;
  }
  uVar22 = local_138;
  if (bVar51) {
    uVar27 = local_138 + 4;
    uVar21 = (lVar3 + num_bytes) - uVar33;
    iVar13 = 0;
    uVar16 = uVar33;
    iVar31 = iVar14;
LAB_0010bfdb:
    uVar36 = uVar21 >> 3;
    local_150 = local_150 - 1;
    uVar22 = local_f0 - 1;
    if (local_150 <= local_f0 - 1) {
      uVar22 = local_150;
    }
    if (4 < *(int *)(literal_context_lut + 4)) {
      uVar22 = 0;
    }
    uVar33 = uVar16 + 1;
    uVar39 = uVar42;
    if (uVar33 < uVar42) {
      uVar39 = uVar33;
    }
    local_c0 = lVar8 + uVar16 + 1;
    if (uVar42 <= local_c0) {
      local_c0 = uVar42;
    }
    uVar34 = *(ulong *)(literal_context_lut + 0x50);
    lVar28 = *(long *)&params[7].dist.alphabet_size_max;
    uVar23 = uVar33 & ringbuffer_mask;
    iVar14 = *(int *)(ringbuffer + uVar23);
    local_180 = (int *)(ringbuffer + uVar23);
    psVar41 = *(size_t **)backward_references;
    bVar51 = true;
    if (back_refs_position <= psVar41) {
LAB_0010c164:
      uVar40 = (uint)(iVar14 * 0x1e35a7bd) >> 0x11;
      uVar45 = (ulong)uVar40;
      uVar17 = (ulong)((uint)local_150 & 7);
      local_140 = 0x7e4;
      lVar46 = 0;
      local_118 = 0;
      local_120 = 0;
LAB_0010c1bd:
      uVar29 = (ulong)*(int *)((long)&(hasher->common).extra + lVar46 * 4);
      uVar24 = uVar33 - uVar29;
      if ((((lVar46 == 0) || (*(char *)(lVar28 + 0x30000 + (uVar24 & 0xffff)) == (char)uVar40)) &&
          (uVar29 <= uVar39)) && (uVar24 < uVar33)) {
        uVar30 = uVar17;
        if (7 < local_150) {
          lVar50 = 0;
          uVar37 = 0;
LAB_0010c20b:
          if (*(ulong *)(local_180 + uVar37 * 2) ==
              *(ulong *)(ringbuffer + uVar37 * 8 + (uVar24 & ringbuffer_mask)))
          goto code_r0x0010c21d;
          uVar30 = *(ulong *)(ringbuffer + uVar37 * 8 + (uVar24 & ringbuffer_mask)) ^
                   *(ulong *)(local_180 + uVar37 * 2);
          uVar24 = 0;
          if (uVar30 != 0) {
            for (; (uVar30 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
            }
          }
          uVar37 = (uVar24 >> 3 & 0x1fffffff) - lVar50;
          goto LAB_0010c259;
        }
        uVar37 = 0;
        piVar2 = local_180;
        goto joined_r0x0010c2ec;
      }
      goto LAB_0010c2ca;
    }
    uVar17 = (ulong)(int)num_literals[(long)psVar41 * 2];
    if (uVar17 < uVar33) {
      psVar15 = num_literals + (long)psVar41 * 2;
      do {
        psVar41 = (size_t *)((long)psVar41 + 1);
        if (back_refs_position == psVar41) {
          *(size_t **)backward_references = psVar41;
          psVar41 = back_refs_position;
          bVar51 = true;
          goto LAB_0010c164;
        }
        uVar17 = (ulong)(int)psVar15[2];
        psVar15 = psVar15 + 2;
      } while (uVar17 < uVar33);
      *(size_t **)backward_references = psVar41;
      bVar51 = back_refs_position <= psVar41;
    }
    else {
      psVar15 = num_literals + (long)psVar41 * 2;
      bVar51 = false;
    }
    if (uVar33 != uVar17 || bVar11) goto LAB_0010c164;
    local_120 = (ulong)(int)(uint)psVar15[1];
    if (uVar33 <= uVar33 - local_120) {
      local_120 = 0;
      local_118 = 0;
      goto LAB_0010c84a;
    }
    if ((uint)psVar15[1] <= *(uint *)((long)psVar15 + 0xc)) {
      uVar22 = uVar33 - local_120 & ringbuffer_mask;
      if (local_150 < 8) {
        uVar16 = 0;
        goto LAB_0010d3bb;
      }
      lVar28 = 0;
      uVar16 = 0;
      goto LAB_0010d2d3;
    }
    local_120 = 0;
    local_118 = 0;
    goto LAB_0010c84a;
  }
LAB_0010cd63:
  local_138 = uVar22;
  if (local_c0 < local_e8) {
LAB_0010cd6d:
    uVar16 = local_e8 + 0xf;
LAB_0010cd71:
    if ((local_e8 <= local_c0) && (uVar16 != 0)) {
      *(int *)((long)&(hasher->common).dict_num_lookups + 4) =
           (int)(hasher->common).dict_num_lookups;
      pvVar19 = (hasher->common).extra;
      *(void **)((long)&(hasher->common).extra + 4) = pvVar19;
      iVar31 = (int)local_e8;
      *(int *)&(hasher->common).extra = iVar31;
      *(int *)&(hasher->common).dict_num_matches = iVar31 + auVar52._0_4_;
      *(int *)((long)&(hasher->common).dict_num_matches + 4) = iVar31 + auVar52._4_4_;
      (hasher->common).params.type = iVar31 + auVar52._8_4_;
      (hasher->common).params.bucket_bits = iVar31 + auVar52._12_4_;
      (hasher->common).params.block_bits = iVar31 + -3;
      (hasher->common).params.hash_len = iVar31 + 3;
      iVar31 = (int)pvVar19;
      (hasher->common).params.num_last_distances_to_check = iVar31 + auVar52._0_4_;
      (hasher->common).is_prepared_ = iVar31 + auVar52._4_4_;
      *(int *)&hasher->privat = iVar31 + auVar52._8_4_;
      *(int *)((long)&hasher->privat + 4) = iVar31 + auVar52._12_4_;
      (hasher->privat)._H5.block_size_ = CONCAT44(iVar31 + 3,iVar31 + -3);
    }
  }
  else {
    uVar22 = (ulong)*(int *)&(hasher->common).extra;
    if (local_e8 != uVar22) {
      uVar27 = (ulong)*(int *)((long)&(hasher->common).extra + 4);
      uVar16 = 1;
      if (local_e8 != uVar27) {
        uVar22 = (local_e8 + 3) - uVar22;
        if (uVar22 < 7) {
          bVar20 = (byte)((int)uVar22 << 2);
          uVar40 = 0x9750468;
        }
        else {
          uVar27 = (local_e8 + 3) - uVar27;
          if (6 < uVar27) {
            uVar16 = 2;
            if ((local_e8 != (long)(int)(hasher->common).dict_num_lookups) &&
               (uVar16 = 3, local_e8 != (long)*(int *)((long)&(hasher->common).dict_num_lookups + 4)
               )) goto LAB_0010cd6d;
            goto LAB_0010cd71;
          }
          bVar20 = (byte)((int)uVar27 << 2);
          uVar40 = 0xfdb1ace;
        }
        uVar16 = (ulong)(uVar40 >> (bVar20 & 0x1f) & 0xf);
      }
      goto LAB_0010cd71;
    }
    uVar16 = 0;
  }
  uVar40 = (uint)local_138;
  *(uint *)local_d0 = uVar40;
  *(uint *)((long)local_d0 + 4) = iVar14 << 0x19 | (uint)local_f0;
  uVar22 = (ulong)*(uint *)(literal_context_lut + 0x44) + 0x10;
  uVar43 = 0;
  if (uVar22 <= uVar16) {
    bVar20 = (byte)*(uint *)(literal_context_lut + 0x40);
    uVar27 = ((4L << (bVar20 & 0x3f)) + (uVar16 - *(uint *)(literal_context_lut + 0x44))) - 0x10;
    uVar43 = 0x1f;
    uVar48 = (uint)uVar27;
    if (uVar48 != 0) {
      for (; uVar48 >> uVar43 == 0; uVar43 = uVar43 - 1) {
      }
    }
    uVar43 = (uVar43 ^ 0xffffffe0) + 0x1f;
    uVar21 = (ulong)((uVar27 >> ((ulong)uVar43 & 0x3f) & 1) != 0);
    lVar28 = (ulong)uVar43 - (ulong)*(uint *)(literal_context_lut + 0x40);
    uVar16 = (~(-1 << (bVar20 & 0x1f)) & uVar48) + uVar22 +
             (uVar21 + lVar28 * 2 + 0xfffe << (bVar20 & 0x3f)) | lVar28 * 0x400;
    uVar43 = (uint)(uVar27 - (uVar21 + 2 << ((byte)uVar43 & 0x3f)) >> (bVar20 & 0x3f));
  }
  *(short *)((long)local_d0 + 0xe) = (short)uVar16;
  *(uint *)(local_d0 + 1) = uVar43;
  if (5 < local_138) {
    if (local_138 < 0x82) {
      uVar40 = 0x1f;
      uVar43 = (uint)(local_138 - 2);
      if (uVar43 != 0) {
        for (; uVar43 >> uVar40 == 0; uVar40 = uVar40 - 1) {
        }
      }
      uVar40 = (int)(local_138 - 2 >> ((char)(uVar40 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar40 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_138 < 0x842) {
      uVar43 = 0x1f;
      if (uVar40 - 0x42 != 0) {
        for (; uVar40 - 0x42 >> uVar43 == 0; uVar43 = uVar43 - 1) {
        }
      }
      uVar40 = (uVar43 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar40 = 0x15;
      if (0x1841 < local_138) {
        uVar40 = (uint)(ushort)(0x17 - (local_138 < 0x5842));
      }
    }
  }
  uVar43 = iVar14 + (uint)local_f0;
  if (uVar43 < 10) {
    uVar48 = uVar43 - 2;
  }
  else if (uVar43 < 0x86) {
    uVar43 = uVar43 - 6;
    uVar48 = 0x1f;
    if (uVar43 != 0) {
      for (; uVar43 >> uVar48 == 0; uVar48 = uVar48 - 1) {
      }
    }
    uVar48 = (uVar43 >> ((char)(uVar48 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar48 ^ 0xffffffe0) * 2 +
             0x42;
  }
  else {
    uVar48 = 0x17;
    if (uVar43 < 0x846) {
      uVar48 = 0x1f;
      if (uVar43 - 0x46 != 0) {
        for (; uVar43 - 0x46 >> uVar48 == 0; uVar48 = uVar48 - 1) {
        }
      }
      uVar48 = (uVar48 ^ 0xffe0) + 0x2c;
    }
  }
  uVar5 = (ushort)uVar48;
  sVar26 = (uVar5 & 7) + ((ushort)uVar40 & 7) * 8;
  if ((((uVar16 & 0x3ff) == 0) && ((ushort)uVar40 < 8)) && (uVar5 < 0x10)) {
    if (7 < uVar5) {
      sVar26 = sVar26 + 0x40;
    }
  }
  else {
    iVar14 = ((uVar40 & 0xffff) >> 3) * 3 + ((uVar48 & 0xffff) >> 3);
    sVar26 = sVar26 + ((ushort)(0x520d40 >> ((char)iVar14 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar14 * 0x40 + 0x40;
  }
  *(short *)((long)local_d0 + 0xc) = sVar26;
  *num_commands = *num_commands + local_138;
  position = local_f0 + uVar33;
  uVar22 = sVar35;
  if (position < sVar35) {
    uVar22 = position;
  }
  uVar16 = uVar33 + 2;
  if (local_e8 < local_f0 >> 2) {
    uVar27 = position + local_e8 * -4;
    if (uVar27 < uVar16) {
      uVar27 = uVar16;
    }
    uVar16 = uVar27;
    if (uVar22 < uVar27) {
      uVar16 = uVar22;
    }
  }
  local_b0 = lVar44 + local_f0 * 2 + uVar33;
  local_d0 = local_d0 + 2;
  if (uVar16 < uVar22) {
    lVar28 = *(long *)&params[7].dist.alphabet_size_max;
    do {
      uVar40 = (uint)(*(int *)(ringbuffer + (uVar16 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
      uVar27 = (ulong)uVar40;
      uVar48 = uVar40 & 0x1ff;
      uVar5 = *(ushort *)((long)&(params->hasher).block_bits + (ulong)uVar48 * 2);
      *(ushort *)((long)&(params->hasher).block_bits + (ulong)uVar48 * 2) = uVar5 + 1;
      uVar43 = uVar5 & 0x1ff;
      uVar33 = uVar16 - *(uint *)(lVar28 + uVar27 * 4);
      *(char *)(lVar28 + 0x30000 + (uVar16 & 0xffff)) = (char)uVar40;
      if (0xfffe < uVar33) {
        uVar33 = 0xffff;
      }
      lVar46 = (ulong)(uVar48 << 0xb) + lVar28 + 0x40000;
      *(short *)(lVar46 + (ulong)uVar43 * 4) = (short)uVar33;
      *(undefined2 *)(lVar46 + 2 + (ulong)uVar43 * 4) =
           *(undefined2 *)(lVar28 + 0x20000 + uVar27 * 2);
      *(int *)(lVar28 + uVar27 * 4) = (int)uVar16;
      *(short *)(lVar28 + 0x20000 + uVar27 * 2) = (short)uVar43;
      uVar16 = uVar16 + 1;
    } while (uVar22 != uVar16);
    local_138 = 0;
  }
  else {
    local_138 = 0;
  }
LAB_0010d14a:
  uVar33 = position;
  if (uVar1 <= position + 4) goto LAB_0010d3f7;
  goto LAB_0010b71d;
code_r0x0010b88e:
  uVar27 = uVar27 + 1;
  lVar28 = lVar28 + -8;
  if (local_150 >> 3 == uVar27) goto LAB_0010d379;
  goto LAB_0010b878;
code_r0x0010c21d:
  uVar37 = uVar37 + 1;
  lVar50 = lVar50 + -8;
  if (uVar36 == uVar37) goto code_r0x0010c22e;
  goto LAB_0010c20b;
code_r0x0010c22e:
  uVar37 = -lVar50;
  piVar2 = (int *)((long)local_180 - lVar50);
joined_r0x0010c2ec:
  for (; (uVar30 != 0 && (ringbuffer[uVar37 + (uVar24 & ringbuffer_mask)] == (uint8_t)*piVar2));
      uVar37 = uVar37 + 1) {
    uVar30 = uVar30 - 1;
    piVar2 = (int *)((long)piVar2 + 1);
  }
LAB_0010c259:
  if ((!bVar51 && !bVar11) &&
     (uVar24 = (ulong)(int)num_literals[(long)psVar41 * 2], uVar24 < uVar37 + uVar33)) {
    uVar37 = uVar24 - uVar33;
  }
  if ((1 < uVar37) && (uVar24 = uVar37 * 0x87 + 0x78f, local_140 < uVar24)) {
    if (lVar46 != 0) {
      uVar24 = uVar24 - ((0x1ca10U >> ((byte)lVar46 & 0xe) & 0xe) + 0x27);
    }
    if (local_140 < uVar24) {
      uVar22 = uVar37;
      local_140 = uVar24;
      local_120 = uVar29;
      local_118 = uVar37;
    }
  }
LAB_0010c2ca:
  lVar46 = lVar46 + 1;
  if (lVar46 == 0x10) goto LAB_0010c30e;
  goto LAB_0010c1bd;
LAB_0010c30e:
  uVar43 = uVar40 & 0x1ff;
  lVar50._0_4_ = params[7].dist.distance_postfix_bits;
  lVar50._4_4_ = params[7].dist.num_direct_distance_codes;
  uVar24 = uVar33 - *(uint *)(lVar28 + uVar45 * 4);
  uVar5 = *(ushort *)(lVar28 + 0x20000 + uVar45 * 2);
  if (lVar50 != 0) {
    lVar46 = (ulong)(uVar43 << 0xb) + lVar28 + 0x40000;
    uVar30 = 0;
    uVar29 = uVar24;
    uVar47 = uVar5;
LAB_0010c363:
    uVar30 = uVar29 + uVar30;
    if (uVar30 <= uVar39) {
      if (uVar22 + uVar23 <= ringbuffer_mask) {
        uVar29 = uVar33 - uVar30 & ringbuffer_mask;
        if ((ringbuffer_mask < uVar22 + uVar29) ||
           (ringbuffer[uVar22 + uVar23] != ringbuffer[uVar22 + uVar29])) goto LAB_0010c3fe;
        uVar37 = uVar17;
        if (7 < local_150) {
          lVar32 = 0;
          uVar38 = 0;
LAB_0010c3ba:
          if (*(ulong *)(local_180 + uVar38 * 2) == *(ulong *)(ringbuffer + uVar38 * 8 + uVar29))
          goto code_r0x0010c3cd;
          uVar37 = *(ulong *)(ringbuffer + uVar38 * 8 + uVar29) ^ *(ulong *)(local_180 + uVar38 * 2)
          ;
          uVar29 = 0;
          if (uVar37 != 0) {
            for (; (uVar37 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
            }
          }
          uVar38 = (uVar29 >> 3 & 0x1fffffff) - lVar32;
          goto LAB_0010c42c;
        }
        uVar38 = 0;
        piVar2 = local_180;
        goto joined_r0x0010c4a0;
      }
      goto LAB_0010c3fe;
    }
  }
LAB_0010c4e7:
  uVar47 = *(ushort *)((long)&(params->hasher).block_bits + (ulong)uVar43 * 2);
  *(ushort *)((long)&(params->hasher).block_bits + (ulong)uVar43 * 2) = uVar47 + 1;
  uVar48 = uVar47 & 0x1ff;
  *(char *)(lVar28 + 0x30000 + (uVar33 & 0xffff)) = (char)uVar40;
  if (0xfffe < uVar24) {
    uVar24 = 0xffff;
  }
  lVar46 = lVar28 + 0x40000 + (ulong)(uVar43 << 0xb);
  *(short *)(lVar46 + (ulong)uVar48 * 4) = (short)uVar24;
  *(ushort *)(lVar46 + 2 + (ulong)uVar48 * 4) = uVar5;
  *(int *)(lVar28 + uVar45 * 4) = (int)uVar33;
  *(short *)(lVar28 + 0x20000 + uVar45 * 2) = (short)uVar48;
  if (local_140 != 0x7e4) {
    iVar14 = 0;
    goto LAB_0010c89a;
  }
  if (bVar11) {
    sVar9 = params[7].dist.max_distance;
    uVar22 = *(ulong *)(sVar9 + 8);
    local_d8 = *(ulong *)(sVar9 + 0x10);
    local_140 = 0x7e4;
    if (uVar22 >> 7 <= local_d8) {
      uVar36 = (ulong)((uint)(*local_180 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
      lVar28 = *(long *)(literal_context_lut + 0x78);
      iVar14 = 0;
      local_140 = 0x7e4;
      bVar51 = true;
LAB_0010c63a:
      uVar22 = uVar22 + 1;
      *(ulong *)(sVar9 + 8) = uVar22;
      bVar20 = *(byte *)(lVar28 + uVar36);
      uVar39 = (ulong)bVar20;
      if ((uVar39 != 0) && (uVar39 <= local_150)) {
        uVar23 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar36 * 2);
        lVar46 = *(long *)(literal_context_lut + 0x58);
        pcVar25 = (char *)(uVar23 * uVar39 + *(long *)(lVar46 + 0xa8) +
                          (ulong)*(uint *)(lVar46 + 0x20 + uVar39 * 4));
        if (7 < bVar20) {
          uVar45 = (ulong)(bVar20 & 0xfffffff8);
          lVar50 = 0;
          uVar17 = 0;
LAB_0010c6b0:
          if (*(ulong *)(pcVar25 + uVar17 * 8) == *(ulong *)(local_180 + uVar17 * 2))
          goto code_r0x0010c6c2;
          uVar45 = *(ulong *)(local_180 + uVar17 * 2) ^ *(ulong *)(pcVar25 + uVar17 * 8);
          uVar17 = 0;
          if (uVar45 != 0) {
            for (; (uVar45 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
            }
          }
          uVar17 = (uVar17 >> 3 & 0x1fffffff) - lVar50;
          goto LAB_0010c704;
        }
        uVar45 = 0;
        goto LAB_0010c7ff;
      }
      goto LAB_0010c778;
    }
    iVar14 = 0;
    goto LAB_0010c89a;
  }
  psVar41 = *(size_t **)backward_references;
LAB_0010c84a:
  if ((psVar41 < back_refs_position) && (uVar33 == (long)(int)num_literals[(long)psVar41 * 2])) {
    iVar10 = (int)num_literals[(long)psVar41 * 2 + 1];
    if (*(int *)((long)num_literals + (long)psVar41 * 0x10 + 0xc) < iVar10) {
      uVar40 = *(uint *)((long)num_literals + (long)psVar41 * 0x10 + 4);
      uVar22 = (ulong)uVar40;
      iVar14 = 0;
      if (uVar40 - 4 < 0x15 && iVar10 < 0x7ffffffd) {
        uVar43 = ~(uint)uVar39 + iVar10;
        lVar28 = *(long *)(literal_context_lut + 0x58);
        iVar31 = (int)uVar43 >> (*(byte *)(lVar28 + uVar22) & 0x1f);
        if (iVar31 < *(int *)(literal_context_lut + 0x60)) {
          uVar48 = *(uint *)(lVar28 + 0x20 + uVar22 * 4);
          uVar7 = kBitMask[*(byte *)(lVar28 + uVar22)];
          lVar28 = *(long *)(lVar28 + 0xa8);
          uVar18 = BrotliGetTransforms();
          pvVar19 = malloc(uVar22 * 10);
          iVar31 = BrotliTransformDictionaryWord
                             (pvVar19,(ulong)uVar48 + lVar28 +
                                      (long)(int)((uVar43 & uVar7) * uVar40),uVar22,uVar18,iVar31);
          iVar13 = bcmp(local_180,pvVar19,(long)iVar31);
          auVar52 = _DAT_0013b100;
          if (iVar13 == 0) {
            iVar14 = uVar40 - iVar31;
            local_118 = (long)iVar31;
            local_120 = (long)iVar10;
          }
        }
      }
      goto LAB_0010d36a;
    }
  }
  iVar14 = 0;
  local_140 = 0x7e4;
LAB_0010c89a:
  if (local_140 < local_110 + 0xaf) {
    uVar33 = uVar16;
    iVar14 = iVar31;
    uVar22 = local_138;
    local_c0 = lVar8 + uVar16;
    if (uVar42 <= lVar8 + uVar16) {
      local_c0 = uVar42;
    }
    goto LAB_0010cd63;
  }
  local_e8 = local_120;
  local_f0 = local_118;
  uVar22 = uVar27;
  if (iVar13 == 3) goto LAB_0010cd63;
  local_138 = local_138 + 1;
  iVar13 = iVar13 + 1;
  uVar36 = uVar16 + 5;
  uVar21 = uVar21 - 1;
  uVar16 = uVar33;
  uVar22 = local_138;
  local_110 = local_140;
  iVar31 = iVar14;
  if (uVar1 <= uVar36) goto LAB_0010cd63;
  goto LAB_0010bfdb;
code_r0x0010c3cd:
  uVar38 = uVar38 + 1;
  lVar32 = lVar32 + -8;
  if (uVar36 == uVar38) goto code_r0x0010c3de;
  goto LAB_0010c3ba;
code_r0x0010c3de:
  uVar38 = -lVar32;
  piVar2 = (int *)((long)local_180 - lVar32);
joined_r0x0010c4a0:
  for (; (uVar37 != 0 && (ringbuffer[uVar38 + uVar29] == (uint8_t)*piVar2)); uVar38 = uVar38 + 1) {
    uVar37 = uVar37 - 1;
    piVar2 = (int *)((long)piVar2 + 1);
  }
LAB_0010c42c:
  if ((!bVar51 && !bVar11) &&
     (uVar29 = (ulong)(int)num_literals[(long)psVar41 * 2], uVar29 < uVar38 + uVar33)) {
    uVar38 = uVar29 - uVar33;
  }
  if (3 < uVar38) {
    iVar14 = 0x1f;
    if ((uint)uVar30 != 0) {
      for (; (uint)uVar30 >> iVar14 == 0; iVar14 = iVar14 + -1) {
      }
    }
    uVar29 = (ulong)(iVar14 * -0x1e + 0x780) + uVar38 * 0x87;
    if (local_140 < uVar29) {
      uVar22 = uVar38;
      local_140 = uVar29;
      local_120 = uVar30;
      local_118 = uVar38;
    }
  }
LAB_0010c3fe:
  uVar29 = (ulong)uVar47;
  uVar47 = *(ushort *)(lVar46 + 2 + uVar29 * 4);
  uVar29 = (ulong)*(ushort *)(lVar46 + uVar29 * 4);
  lVar50 = lVar50 + -1;
  if (lVar50 == 0) goto LAB_0010c4e7;
  goto LAB_0010c363;
code_r0x0010c6c2:
  uVar17 = uVar17 + 1;
  lVar50 = lVar50 + -8;
  if (bVar20 >> 3 == uVar17) goto code_r0x0010c6ce;
  goto LAB_0010c6b0;
code_r0x0010c6ce:
  pcVar25 = pcVar25 + -lVar50;
LAB_0010c7ff:
  uVar24 = uVar39 & 7;
  uVar17 = uVar45;
  if ((bVar20 & 7) != 0) {
    uVar29 = uVar45 | uVar24;
    do {
      uVar17 = uVar45;
      if (*(char *)((long)local_180 + uVar45) != *pcVar25) break;
      pcVar25 = pcVar25 + 1;
      uVar45 = uVar45 + 1;
      uVar24 = uVar24 - 1;
      uVar17 = uVar29;
    } while (uVar24 != 0);
  }
LAB_0010c704:
  if (((uVar17 != 0) && (uVar39 < *(uint *)(literal_context_lut + 100) + uVar17)) &&
     (uVar39 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                              ((char)(uVar39 - uVar17) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar39 - uVar17) * 4 << (*(byte *)(lVar46 + uVar39) & 0x3f)) +
               uVar23 + local_c0 + 1, uVar39 <= uVar34)) {
    iVar10 = 0x1f;
    if ((uint)uVar39 != 0) {
      for (; (uint)uVar39 >> iVar10 == 0; iVar10 = iVar10 + -1) {
      }
    }
    uVar23 = (uVar17 * 0x87 - (ulong)(uint)(iVar10 * 0x1e)) + 0x780;
    if (local_140 <= uVar23) {
      iVar14 = (uint)bVar20 - (int)uVar17;
      local_d8 = local_d8 + 1;
      *(ulong *)(sVar9 + 0x10) = local_d8;
      local_140 = uVar23;
      local_120 = uVar39;
      local_118 = uVar17;
    }
  }
LAB_0010c778:
  uVar36 = uVar36 + 1;
  bVar12 = !bVar51;
  bVar51 = false;
  if (bVar12) goto LAB_0010c89a;
  goto LAB_0010c63a;
LAB_0010d2d3:
  if (*(ulong *)(ringbuffer + uVar16 * 8 + uVar23) == *(ulong *)(ringbuffer + uVar16 * 8 + uVar22))
  goto code_r0x0010d2e0;
  uVar16 = *(ulong *)(ringbuffer + uVar16 * 8 + uVar22) ^
           *(ulong *)(ringbuffer + uVar16 * 8 + uVar23);
  uVar22 = 0;
  if (uVar16 != 0) {
    for (; (uVar16 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
    }
  }
  uVar16 = (uVar22 >> 3 & 0x1fffffff) - lVar28;
  goto LAB_0010d311;
code_r0x0010d2e0:
  uVar16 = uVar16 + 1;
  lVar28 = lVar28 + -8;
  if (uVar36 == uVar16) goto code_r0x0010d2f1;
  goto LAB_0010d2d3;
code_r0x0010d2f1:
  local_180 = (int *)(ringbuffer + (uVar23 - lVar28));
  uVar16 = -lVar28;
LAB_0010d3bb:
  local_150 = local_150 & 7;
  for (; (local_150 != 0 && (ringbuffer[uVar16 + uVar22] == (uint8_t)*local_180));
      uVar16 = uVar16 + 1) {
    local_180 = (int *)((long)local_180 + 1);
    local_150 = local_150 - 1;
  }
LAB_0010d311:
  local_118 = (ulong)*(int *)((long)num_literals + (long)psVar41 * 0x10 + 4);
  if (uVar16 < local_118) {
    local_118 = uVar16;
  }
  iVar14 = 0;
LAB_0010d36a:
  local_e8 = local_120;
  local_f0 = local_118;
  uVar22 = local_138 + 1;
  goto LAB_0010cd63;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}